

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_chain_constructors<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>
               (void)

{
  Dimension *pDVar1;
  Dimension DVar2;
  Dimension local_8e0 [2];
  undefined **local_8d8;
  undefined1 local_8d0;
  undefined8 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ordered_boundaries;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  mm;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  mr;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  mb;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  mc1;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  mc2;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>>>
            ();
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mb.colSettings_ = (Column_settings *)birth_comp;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mr.colSettings_ = (Column_settings *)death_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  ::Matrix(&m,(function<bool_(unsigned_int,_unsigned_int)> *)&mb,
           (function<bool_(unsigned_int,_unsigned_int)> *)&mr);
  std::_Function_base::~_Function_base((_Function_base *)&mr);
  std::_Function_base::~_Function_base((_Function_base *)&mb);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x15f);
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mb.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  mr.colSettings_ =
       (Column_settings *)
       CONCAT44(mr.colSettings_._4_4_,(undefined4)m.matrix_.matrix_._M_h._M_element_count);
  mc1.colSettings_ = (Column_settings *)((ulong)mc1.colSettings_._4_4_ << 0x20);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mb,&local_200,0x15f,1,2,&mr,"m.get_number_of_columns()",&mc1,"0");
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mr.colSettings_ = (Column_settings *)birth_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mc1.colSettings_ = (Column_settings *)death_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,true,false,false>>
              *)&mb,&ordered_boundaries,(function<bool_(unsigned_int,_unsigned_int)> *)&mr,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc1,5);
  std::_Function_base::~_Function_base((_Function_base *)&mc1);
  std::_Function_base::~_Function_base((_Function_base *)&mr);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x163);
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_228 = "";
  mc1.colSettings_ =
       (Column_settings *)
       CONCAT44(mc1.colSettings_._4_4_,(Dimension)mb.matrix_.matrix_._M_h._M_element_count);
  mc2.colSettings_ = (Column_settings *)CONCAT44(mc2.colSettings_._4_4_,7);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mr,&local_230,0x163,1,2,&mc1,"mb.get_number_of_columns()",&mc2,"7");
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x164);
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_828 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_820 = "";
  DVar2 = Gudhi::persistence_matrix::
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
          ::get_column_dimension(&mb.matrix_,2);
  mc1.colSettings_ = (Column_settings *)CONCAT44(mc1.colSettings_._4_4_,DVar2);
  mc2.colSettings_ = (Column_settings *)((ulong)mc2.colSettings_ & 0xffffffff00000000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mr,&local_828,0x164,1,2,&mc1,"mb.get_column_dimension(2)",&mc2,"0");
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x165);
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
       _M_member_pointer & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_838 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_830 = "";
  DVar2 = Gudhi::persistence_matrix::
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
          ::get_column_dimension(&mb.matrix_,6);
  mc1.colSettings_ = (Column_settings *)CONCAT44(mc1.colSettings_._4_4_,DVar2);
  mc2.colSettings_ = (Column_settings *)CONCAT44(mc2.colSettings_._4_4_,2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mr,&local_838,0x165,1,2,&mc1,"mb.get_column_dimension(6)",&mc2,"2");
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mc1.colSettings_ = (Column_settings *)birth_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = (void *)0x0;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  mc2.colSettings_ = (Column_settings *)death_comp;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_manager;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  ::Matrix(&mr,5,(function<bool_(unsigned_int,_unsigned_int)> *)&mc1,
           (function<bool_(unsigned_int,_unsigned_int)> *)&mc2,0xffffffff);
  std::_Function_base::~_Function_base((_Function_base *)&mc2);
  std::_Function_base::~_Function_base((_Function_base *)&mc1);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x169);
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_member_pointer =
       mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused
       ._M_member_pointer & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  mc2.colSettings_ =
       (Column_settings *)
       CONCAT44(mc2.colSettings_._4_4_,(undefined4)mr.matrix_.matrix_._M_h._M_element_count);
  mm.colSettings_ = (Column_settings *)((ulong)mm.colSettings_._4_4_ << 0x20);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mc1,&local_2a0,0x169,1,2,&mc2,"mr.get_number_of_columns()",&mm,"0");
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  ::Matrix(&mc1,&mb);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  ::Matrix(&mc2,&mb);
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b0,0x16e);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2c8 = "";
  local_8e0[0] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mm,&local_2d0,0x16e,1,2,&local_8d8,"mc1.get_number_of_columns()",local_8e0,"7");
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e0,0x16f);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_848 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_840 = "";
  local_8d8._0_4_ =
       Gudhi::persistence_matrix::
       Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
       ::get_column_dimension(&mc1.matrix_,2);
  local_8e0[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_848,0x16f,1,2,&local_8d8,"mc1.get_column_dimension(2)",local_8e0,"0");
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_300,0x170);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_858 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_850 = "";
  local_8d8._0_4_ =
       Gudhi::persistence_matrix::
       Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
       ::get_column_dimension(&mc1.matrix_,6);
  local_8e0[0] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_858,0x170,1,2,&local_8d8,"mc1.get_column_dimension(6)",local_8e0,"2");
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0x171);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_8e0[0] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mm,&local_340,0x171,1,2,&local_8d8,"mc2.get_number_of_columns()",local_8e0,"7");
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0x172);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_868 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_860 = "";
  local_8d8._0_4_ =
       Gudhi::persistence_matrix::
       Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
       ::get_column_dimension(&mc2.matrix_,2);
  local_8e0[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_868,0x172,1,2,&local_8d8,"mc2.get_column_dimension(2)",local_8e0,"0");
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_370,0x173);
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_pod_data[0]
       = '\0';
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001e9068;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       &boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x19b234;
  local_878 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_870 = "";
  DVar2 = Gudhi::persistence_matrix::
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
          ::get_column_dimension(&mc2.matrix_,6);
  local_8d8 = (undefined **)CONCAT44(local_8d8._4_4_,DVar2);
  local_8e0[0] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_878,0x173,1,2,&local_8d8,"mc2.get_column_dimension(6)",local_8e0,"2");
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  ::Matrix(&mm,&mb);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_390,0x177);
  local_8d0 = 0;
  local_8d8 = &PTR__lazy_ostream_001e9068;
  local_8c8 = &boost::unit_test::lazy_ostream::inst;
  local_8c0 = "";
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a8 = "";
  local_8e0[0] = (Dimension)mm.matrix_.matrix_._M_h._M_element_count;
  pDVar1 = local_8e0 + 1;
  local_8e0[1] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8d8,&local_3b0,0x177,1,2,local_8e0,"mm.get_number_of_columns()",pDVar1,"7");
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3c0,0x178);
  local_8d0 = 0;
  local_8d8 = &PTR__lazy_ostream_001e9068;
  local_8c8 = &boost::unit_test::lazy_ostream::inst;
  local_8c0 = "";
  local_888 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_880 = "";
  local_8e0[0] = Gudhi::persistence_matrix::
                 Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
                 ::get_column_dimension(&mm.matrix_,2);
  local_8e0[1] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8d8,&local_888,0x178,1,2,local_8e0,"mm.get_column_dimension(2)",pDVar1,"0");
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x179);
  local_8d0 = 0;
  local_8d8 = &PTR__lazy_ostream_001e9068;
  local_8c8 = &boost::unit_test::lazy_ostream::inst;
  local_8c0 = "";
  local_898 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_890 = "";
  local_8e0[0] = Gudhi::persistence_matrix::
                 Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
                 ::get_column_dimension(&mm.matrix_,6);
  local_8e0[1] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8d8,&local_898,0x179,1,2,local_8e0,"mm.get_column_dimension(6)",pDVar1,"2");
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_400,0x17a);
  local_8d0 = 0;
  local_8d8 = &PTR__lazy_ostream_001e9068;
  local_8c8 = &boost::unit_test::lazy_ostream::inst;
  local_8c0 = "";
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_418 = "";
  local_8e0[0] = (Dimension)mb.matrix_.matrix_._M_h._M_element_count;
  local_8e0[1] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8d8,&local_420,0x17a,1,2,local_8e0,"mb.get_number_of_columns()",pDVar1,"0");
  Gudhi::persistence_matrix::swap(&mm,&mb);
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_430,0x17e);
  local_8d0 = 0;
  local_8d8 = &PTR__lazy_ostream_001e9068;
  local_8c8 = &boost::unit_test::lazy_ostream::inst;
  local_8c0 = "";
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_448 = "";
  local_8e0[0] = (Dimension)mm.matrix_.matrix_._M_h._M_element_count;
  local_8e0[1] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8d8,&local_450,0x17e,1,2,local_8e0,"mm.get_number_of_columns()",pDVar1,"0");
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_460,0x17f);
  local_8d0 = 0;
  local_8d8 = &PTR__lazy_ostream_001e9068;
  local_8c8 = &boost::unit_test::lazy_ostream::inst;
  local_8c0 = "";
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_478 = "";
  local_8e0[0] = (Dimension)mb.matrix_.matrix_._M_h._M_element_count;
  local_8e0[1] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_8d8,&local_480,0x17f,1,2,local_8e0,"mb.get_number_of_columns()",pDVar1,"7");
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_490,0x180);
  local_8d0 = 0;
  local_8d8 = &PTR__lazy_ostream_001e9068;
  local_8c8 = &boost::unit_test::lazy_ostream::inst;
  local_8c0 = "";
  local_8a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_8a0 = "";
  local_8e0[0] = Gudhi::persistence_matrix::
                 Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
                 ::get_column_dimension(&mb.matrix_,2);
  local_8e0[1] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8d8,&local_8a8,0x180,1,2,local_8e0,"mb.get_column_dimension(2)",pDVar1,"0");
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4a8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4b0,0x181);
  local_8d0 = 0;
  local_8d8 = &PTR__lazy_ostream_001e9068;
  local_8c8 = &boost::unit_test::lazy_ostream::inst;
  local_8c0 = "";
  local_8b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_8b0 = "";
  local_8e0[0] = Gudhi::persistence_matrix::
                 Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>_>
                 ::get_column_dimension(&mb.matrix_,6);
  local_8e0[1] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_8d8,&local_8b8,0x181,1,2,local_8e0,"mb.get_column_dimension(6)",pDVar1,"2");
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  ::~Matrix(&mm);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  ::~Matrix(&mc2);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  ::~Matrix(&mc1);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  ::~Matrix(&mr);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  ::~Matrix(&mb);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_true,_false,_false>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&ordered_boundaries);
  return;
}

Assistant:

void test_chain_constructors() {
  auto ordered_boundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  // default constructor
  Matrix m(birth_comp, death_comp);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 0);

  // constructor from given @ref boundarymatrix "boundary matrix"
  Matrix mb(ordered_boundaries, birth_comp, death_comp, 5);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);

  // constructor reserving column space
  Matrix mr(5, birth_comp, death_comp);
  BOOST_CHECK_EQUAL(mr.get_number_of_columns(), 0);

  // copy constructor
  Matrix mc1(mb);
  Matrix mc2 = mb;
  BOOST_CHECK_EQUAL(mc1.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mc2.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(6), 2);

  // move constructor
  Matrix mm(std::move(mb));
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 0);

  // swap
  swap(mm, mb);
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 0);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);
}